

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O2

TypeDescriptor * equalToOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  __type _Var1;
  NumberDescriptor *this;
  ostream *poVar2;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (leftValue->_type == STRING) {
    if (rightValue->_type != STRING) goto LAB_0010ebc7;
    this = (NumberDescriptor *)operator_new(0x60);
    std::__cxx11::string::string((string *)&local_38,(string *)&leftValue->_string);
    std::__cxx11::string::string((string *)&bStack_58,(string *)&rightValue->_string);
    _Var1 = std::operator==(&local_38,&bStack_58);
    if (_Var1) {
      value = 1.0;
    }
    else {
      value = 0.0;
    }
    NumberDescriptor::NumberDescriptor(this,value);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    if ((leftValue->_type != NUMBER) || (rightValue->_type != NUMBER)) {
LAB_0010ebc7:
      poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(2);
    }
    this = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor
              (this,(double)(-(ulong)(rightValue->_number == leftValue->_number) &
                            0x3ff0000000000000));
  }
  return &this->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *equalToOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numEqual = new  NumberDescriptor(leftValue->getNumber() == rightValue->getNumber() ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *equalToOperator: " << leftValue->getNumber() << " == " << rightValue->getNumber() << std::endl;
        return numEqual;
    }else if(leftValue->type() == TypeDescriptor::STRING
    && rightValue->type() == TypeDescriptor::STRING ){
        auto *stringEqual = new  NumberDescriptor(leftValue->getString()  == rightValue->getString()  ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *equalToOperator: " << leftValue->getString()  << " == " << rightValue->getString()  << std::endl;
        return stringEqual;
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}